

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O2

void __thiscall
StrongConnectedComponents::getStrongConnectedComponents(StrongConnectedComponents *this,int root)

{
  pointer pvVar1;
  long lVar2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  size_type __n;
  int i;
  ulong uVar9;
  reference rVar10;
  int next;
  int w;
  int local_50;
  int local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar5 = this->sccCounter + 1;
  this->sccCounter = iVar5;
  __n = (size_type)root;
  (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[__n] = iVar5;
  (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[__n] = this->sccCounter;
  local_50 = root;
  rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->visited,__n);
  *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
  std::vector<int,_std::allocator<int>_>::push_back(&this->stack,&local_50);
  uVar9 = 0;
  do {
    lVar6 = (long)local_50;
    pvVar1 = (this->adjList).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[lVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= uVar9) {
      if (((this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6] ==
           (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6]) &&
         ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        do {
          piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_4c = piVar3[-1];
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar3 + -1;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&local_48,&local_4c);
          piVar3 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (piVar3[local_50] < piVar3[local_4c]);
        if (4 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start)) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::push_back(&this->currentSCCs,(value_type *)&local_48);
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      }
      return;
    }
    iVar5 = *(int *)(lVar2 + uVar9 * 4);
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
    rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->visited,(long)iVar5);
    if ((*rVar10._M_p & rVar10._M_mask) == 0) {
      getStrongConnectedComponents(this,(int)local_48._M_impl.super__Vector_impl_data._M_start);
      piVar3 = (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = piVar3 + local_50;
      piVar8 = piVar3 + (int)local_48._M_impl.super__Vector_impl_data._M_start;
LAB_00165c52:
      iVar5 = *piVar7;
      if (*piVar8 < *piVar7) {
        iVar5 = *piVar8;
      }
      *piVar7 = iVar5;
    }
    else {
      piVar3 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3[(int)local_48._M_impl.super__Vector_impl_data._M_start] < piVar3[local_50]) {
        bVar4 = find_vec<int>(&this->stack,(int *)&local_48);
        if (bVar4) {
          piVar7 = (this->lowlink).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + local_50;
          piVar8 = (this->number).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start +
                   (int)local_48._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00165c52;
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void StrongConnectedComponents::getStrongConnectedComponents(int root) {
    sccCounter++;
    lowlink[root] = sccCounter;
    number[root] = sccCounter;
    visited[root] = true;
    stack.push_back(root);

    for (int i = 0; i < adjList[root].size(); i++) {
        int w = adjList[root][i];
        if (!visited[w]) {
            getStrongConnectedComponents(w);
            lowlink[root] = std::min(lowlink[root], lowlink[w]);
        }
        else if (number[w] < number[root]) {
            if (find_vec(stack, w)) {
                lowlink[root] = std::min(lowlink[root], number[w]);
            }
        }
    }

    if ((lowlink[root] == number[root]) && !stack.empty()) {
        int next;
        std::vector<int> scc;

        do {
            next = stack.back();
            stack.pop_back();
            scc.push_back(next);
        } while (number[next] > number[root]);

        if (scc.size() > 1) {
            currentSCCs.push_back(scc);
        }
    }
}